

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_module(lua_State *L)

{
  int idx;
  int iVar1;
  lua_State *L_00;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  int lastarg;
  char *modname;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  lua_State *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe8;
  int idx_00;
  
  L_00 = (lua_State *)luaL_checklstring((lua_State *)modname,lastarg,(size_t *)in_RDI);
  idx = (int)((long)in_RDI->top - (long)in_RDI->base >> 3);
  luaL_pushmodule(L_00,(char *)CONCAT44(idx,in_stack_ffffffffffffffe8),0);
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  iVar1 = lua_type(in_RDI,(int)((ulong)L_00 >> 0x20));
  idx_00 = (int)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0) {
    lua_settop(L_00,idx);
    modinit(L_00,(char *)CONCAT44(idx,in_stack_ffffffffffffffe8));
  }
  else {
    lua_settop(L_00,idx);
  }
  lua_pushvalue((lua_State *)CONCAT44(lastarg,unaff_retaddr),idx_00);
  setfenv(in_stack_00000060);
  dooptions(L_00,idx);
  return 0;
}

Assistant:

static int lj_cf_package_module(lua_State *L)
{
  const char *modname = luaL_checkstring(L, 1);
  int lastarg = (int)(L->top - L->base);
  luaL_pushmodule(L, modname, 1);
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1)) {  /* Module already initialized? */
    lua_pop(L, 1);
  } else {
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, lastarg);
  return LJ_52;
}